

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean MA_allocate_heap(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  AR *ar;
  Pointer pcVar1;
  Integer *pIVar2;
  ulong uVar3;
  Integer IVar4;
  ulong uVar5;
  _AD **pp_Var6;
  _AD *ad;
  char *pcVar7;
  AD *pAVar8;
  Pointer client_space;
  ulongi nbytes;
  Pointer local_48;
  ulong local_40;
  Integer *local_38;
  
  ma_stats.calls[1] = ma_stats.calls[1] + 1;
  if (ma_trace != 0) {
    printf("MA: allocating \'%s\' (%d)\n",name,nelem & 0xffffffff);
  }
  ad = ma_hfree;
  if (ma_initialized == '\0') {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",name);
  }
  else {
    ar = (AR *)(datatype + -1000);
    if (ar < (AR *)0x11) {
      if (nelem < 0) {
        sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",name,nelem);
        goto LAB_001a40f9;
      }
      local_38 = memhandle;
      if (ma_hfree != (AD *)0x0) {
        balloc_after(ar,(Pointer)nelem,(Pointer *)ma_hfree,(ulongi *)&local_48);
        if (ad->nbytes < local_40) {
          do {
            pAVar8 = ad;
            ad = pAVar8->next;
            if (ad == (_AD *)0x0) goto LAB_001a4143;
            balloc_after(ar,(Pointer)nelem,(Pointer *)ad,(ulongi *)&local_48);
          } while (ad->nbytes < local_40);
        }
        else {
          pAVar8 = (AD *)0x0;
        }
        block_split(ad,local_40,1);
        ad->client_space = local_48;
        pp_Var6 = &ma_hfree;
        if (pAVar8 != (AD *)0x0) {
          pp_Var6 = &pAVar8->next;
        }
        *pp_Var6 = ad->next;
LAB_001a41ce:
        pIVar2 = local_38;
        ad->datatype = (Integer)ar;
        ad->nelem = nelem;
        pcVar7 = ad->name;
        if (name != (char *)0x0) {
          strncpy(pcVar7,name,0x20);
          pcVar7 = ad->name + 0x1f;
        }
        *pcVar7 = '\0';
        ad->next = ma_hused;
        pcVar1 = ad->client_space;
        ma_hused = ad;
        ad->checksum = (ulongi)(pcVar1 + (long)&ar->datatype + ad->nbytes + nelem);
        pcVar1[-4] = -0x56;
        pcVar1[-3] = -0x56;
        pcVar1[-2] = -0x56;
        pcVar1[-1] = -0x56;
        builtin_strncpy(ad->client_space + (long)ma_sizeof[ad->datatype] * ad->nelem,"UUUU",4);
        if (ma_hp < ad->name + (ad->nbytes - 0x10)) {
          ma_hp = ad->name + (ad->nbytes - 0x10);
        }
        ma_stats.hblocks = ma_stats.hblocks + 1;
        uVar5 = ma_stats.hblocks;
        if (ma_stats.hblocks < ma_stats.hblocks_max) {
          uVar5 = ma_stats.hblocks_max;
        }
        ma_stats.hbytes = ad->nbytes + ma_stats.hbytes;
        uVar3 = ma_stats.hbytes;
        if (ma_stats.hbytes < ma_stats.hbytes_max) {
          uVar3 = ma_stats.hbytes_max;
        }
        ma_stats.hblocks_max = uVar5;
        ma_stats.hbytes_max = uVar3;
        IVar4 = ma_table_allocate((TableData)ad);
        *pIVar2 = IVar4;
        return (ulong)(IVar4 != -1);
      }
LAB_001a4143:
      ad = (_AD *)ma_hp;
      balloc_after(ar,(Pointer)nelem,(Pointer *)ma_hp,(ulongi *)&local_48);
      if ((Pointer)((long)ad + local_40) <= ma_sp) {
        *(Pointer *)((long)ad + 0x30) = local_48;
        *(ulong *)((long)ad + 0x38) = local_40;
        goto LAB_001a41ce;
      }
      pcVar7 = "block \'%s\', not enough space to allocate %lu bytes";
    }
    else {
      pcVar7 = "block \'%s\', invalid datatype: %ld";
      local_40 = datatype;
    }
    sprintf(ma_ebuf,pcVar7,name,local_40);
  }
LAB_001a40f9:
  ma_error(EL_Nonfatal,ET_External,"MA_allocate_heap",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_allocate_heap(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle    /* RETURN: handle for this block */ )
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_hp;        /* new ma_hp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_allocate_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: allocating '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    /* search the free list */
    ad = list_delete_one(&ma_hfree, ad_big_enough, (Pointer)&ar);

    /* if search of free list failed, try expanding heap region */
    if (ad == (AD *)NULL)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, ma_hp, &client_space, &nbytes);

        new_hp = ma_hp + nbytes;
        if (new_hp > ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "block '%s', not enough space to allocate %lu bytes",
                name, nbytes);
            ma_error(EL_Nonfatal, ET_External, "MA_allocate_heap", ma_ebuf);
            return MA_FALSE;
        }
        else
        {
            /* heap region expanded successfully */
            ad = (AD *)ma_hp;

            /* set fields appropriately */
            ad->client_space = client_space;
            ad->nbytes = nbytes;
        }
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    /* ad->client_space is already set */
    /* ad->nbytes is already set */
    list_insert(ad, &ma_hused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_hp if necessary */
    new_hp = (Pointer)ad + ad->nbytes;
    if (new_hp > ma_hp)
    {
        ma_hp = new_hp;
    }

#ifdef STATS
    ma_stats.hblocks++;
    ma_stats.hblocks_max = max(ma_stats.hblocks, ma_stats.hblocks_max);
    ma_stats.hbytes += ad->nbytes;
    ma_stats.hbytes_max = max(ma_stats.hbytes, ma_stats.hbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}